

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Deserializer.cpp
# Opt level: O2

void __thiscall
adios2::format::BP3Deserializer::ParseVariablesIndex
          (BP3Deserializer *this,BufferSTL *bufferSTL,Engine *engine)

{
  uint uVar1;
  BufferSTL *buffer;
  pointer puVar2;
  bool bVar3;
  size_t sVar4;
  ulong uVar5;
  pointer p_Var6;
  _Result<void> *p_Var7;
  ulong uVar8;
  long lVar9;
  future<void> *async;
  __basic_future<void> *this_00;
  _State_baseV2 *__tmp;
  __basic_future<void> *this_01;
  ulong uVar10;
  _State_baseV2 *__tmp_1;
  size_t sVar11;
  __allocator_type __a2;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_toolkit_format_bp_bp3_BP3Deserializer_cpp:196:32),_std::reference_wrapper<adios2::core::Engine>,_std::reference_wrapper<const_std::vector<char,_std::allocator<char>_>_>,_unsigned_long>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_toolkit_format_bp_bp3_BP3Deserializer_cpp:196:32),_std::reference_wrapper<adios2::core::Engine>,_std::reference_wrapper<const_std::vector<char,_std::allocator<char>_>_>,_unsigned_long>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_108;
  BufferSTL *local_f8;
  BP3Deserializer *local_f0;
  __state_type local_e8;
  __allocator_type __a2_1;
  thread local_a0;
  vector<std::future<void>,_std::allocator<std::future<void>_>_> asyncs;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> asyncPositions;
  type lf_ReadElementIndex;
  __basic_future<void> local_40;
  
  sVar4 = (this->m_Minifooter).PGIndexStart;
  sVar11 = (this->m_Minifooter).VarsIndexStart;
  local_f8 = bufferSTL;
  local_f0 = this;
  lf_ReadElementIndex.this = this;
  std::__cxx11::string::string
            ((string *)&asyncs," BP3 variable index start < pg index start, in call to Open",
             (allocator *)&asyncPositions);
  sVar4 = helper::GetDistance(sVar11,sVar4,(string *)&asyncs);
  local_f8 = (BufferSTL *)&local_f8->m_Buffer;
  std::__cxx11::string::~string((string *)&asyncs);
  buffer = local_f8;
  sVar4 = sVar4 + 0xc;
  uVar8 = ((local_f0->m_Minifooter).AttributesIndexStart - (local_f0->m_Minifooter).VarsIndexStart)
          - 0xc;
  if ((ulong)*(uint *)(&local_f0->field_0x230 + *(long *)(*(long *)local_f0 + -0x18)) == 1) {
    uVar5 = 0;
    sVar11 = sVar4;
    while (uVar5 < uVar8) {
      std::
      tuple_element<0UL,_std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/bp/bp3/BP3Deserializer.cpp:196:32),_std::reference_wrapper<adios2::core::Engine>,_std::reference_wrapper<const_std::vector<char,_std::allocator<char>_>_>,_unsigned_long>_>
      ::type::operator()(&lf_ReadElementIndex,engine,(vector<char,_std::allocator<char>_> *)buffer,
                         sVar11);
      sVar11 = sVar11 + *(uint *)((((_Vector_base<char,_std::allocator<char>_> *)
                                   &buffer->super_Buffer)->_M_impl).super__Vector_impl_data._M_start
                                 + sVar11) + 4;
      uVar5 = sVar11 - sVar4;
    }
  }
  else {
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::vector
              (&asyncs,(ulong)*(uint *)(&local_f0->field_0x230 +
                                       *(long *)(*(long *)local_f0 + -0x18)),
               (allocator_type *)&asyncPositions);
    this_01 = (__basic_future<void> *)
              (ulong)*(uint *)(&local_f0->field_0x230 + *(long *)(*(long *)local_f0 + -0x18));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&asyncPositions,(size_type)this_01,(allocator_type *)&local_108);
    bVar3 = false;
    uVar5 = 0;
    sVar11 = sVar4;
    while (this_00 = &(asyncs.
                       super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->super___basic_future<void>,
          uVar5 < uVar8) {
      lVar9 = 0;
      for (uVar10 = 0;
          uVar10 < *(uint *)(&local_f0->field_0x230 + *(long *)(*(long *)local_f0 + -0x18));
          uVar10 = uVar10 + 1) {
        asyncPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar10] = sVar11;
        uVar1 = *(uint *)((((_Vector_base<char,_std::allocator<char>_> *)&local_f8->super_Buffer)->
                          _M_impl).super__Vector_impl_data._M_start + sVar11);
        if (bVar3) {
          std::future<void>::get
                    ((future<void> *)
                     ((long)&((asyncs.
                               super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super___basic_future<void>)._M_state.
                             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + lVar9));
        }
        puVar2 = asyncPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar11 = sVar11 + uVar1 + 4;
        uVar5 = sVar11 - sVar4;
        if (uVar5 <= uVar8) {
          local_e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var6 = (pointer)operator_new(0x68);
          local_108._M_alloc = &__a2;
          (p_Var6->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
          (p_Var6->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
          (p_Var6->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
               (_func_int **)&PTR___Sp_counted_ptr_inplace_008226d8;
          *(undefined8 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 8) = 0;
          *(undefined4 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x10) = 0;
          (p_Var6->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
          *(undefined4 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x18) = 0;
          *(undefined8 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x20) = 0;
          *(undefined4 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x28) = 0;
          (p_Var6->_M_impl)._M_storage._M_storage.__align =
               (anon_struct_8_0_00000001_for___align)&PTR___Async_state_impl_00822728;
          local_108._M_ptr = p_Var6;
          p_Var7 = (_Result<void> *)operator_new(0x10);
          *(undefined8 *)p_Var7 = 0;
          *(undefined8 *)&p_Var7->field_0x8 = 0;
          std::__future_base::_Result<void>::_Result(p_Var7);
          *(_Result<void> **)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x30) = p_Var7;
          *(unsigned_long *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x38) = puVar2[uVar10]
          ;
          *(BufferSTL **)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x40) = local_f8;
          *(Engine **)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x48) = engine;
          *(BP3Deserializer **)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x50) = local_f0;
          local_a0._M_id._M_thread = (id)0;
          ___a2_1 = (long *)operator_new(0x20);
          *___a2_1 = (long)&PTR___State_00822780;
          ___a2_1[1] = (long)&p_Var6->_M_impl;
          ___a2_1[2] = (long)std::__future_base::
                             _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/bp/bp3/BP3Deserializer.cpp:196:32),_std::reference_wrapper<adios2::core::Engine>,_std::reference_wrapper<const_std::vector<char,_std::allocator<char>_>_>,_unsigned_long>_>,_void>
                             ::_M_run;
          ___a2_1[3] = 0;
          std::thread::_M_start_thread(&local_a0,&__a2_1,0);
          if (___a2_1 != (long *)0x0) {
            (**(code **)(*___a2_1 + 8))();
          }
          std::thread::operator=
                    ((thread *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x20),&local_a0);
          std::thread::~thread(&local_a0);
          local_108._M_ptr = (pointer)0x0;
          std::
          __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/bp/bp3/BP3Deserializer.cpp:196:32),_std::reference_wrapper<adios2::core::Engine>,_std::reference_wrapper<const_std::vector<char,_std::allocator<char>_>_>,_unsigned_long>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/bp/bp3/BP3Deserializer.cpp:196:32),_std::reference_wrapper<adios2::core::Engine>,_std::reference_wrapper<const_std::vector<char,_std::allocator<char>_>_>,_unsigned_long>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
          ::~__allocated_ptr(&local_108);
          _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_108._M_alloc =
               (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_toolkit_format_bp_bp3_BP3Deserializer_cpp:196:32),_std::reference_wrapper<adios2::core::Engine>,_std::reference_wrapper<const_std::vector<char,_std::allocator<char>_>_>,_unsigned_long>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_toolkit_format_bp_bp3_BP3Deserializer_cpp:196:32),_std::reference_wrapper<adios2::core::Engine>,_std::reference_wrapper<const_std::vector<char,_std::allocator<char>_>_>,_unsigned_long>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
                *)local_e8.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
          local_108._M_ptr =
               (pointer)local_e8.
                        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
          local_e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)&p_Var6->_M_impl;
          local_e8.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var6;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_108._M_ptr);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_70);
          if (local_e8.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr == (element_type *)0x0) {
            p_Var6 = (pointer)operator_new(0x58);
            local_108._M_alloc =
                 (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_toolkit_format_bp_bp3_BP3Deserializer_cpp:196:32),_std::reference_wrapper<adios2::core::Engine>,_std::reference_wrapper<const_std::vector<char,_std::allocator<char>_>_>,_unsigned_long>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_toolkit_format_bp_bp3_BP3Deserializer_cpp:196:32),_std::reference_wrapper<adios2::core::Engine>,_std::reference_wrapper<const_std::vector<char,_std::allocator<char>_>_>,_unsigned_long>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
                  *)&__a2_1;
            (p_Var6->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
            (p_Var6->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
            (p_Var6->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
                 (_func_int **)&PTR___Sp_counted_ptr_inplace_008227c0;
            *(undefined8 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 8) = 0;
            *(undefined4 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x10) = 0;
            (p_Var6->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
            *(undefined4 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x18) = 0;
            (p_Var6->_M_impl)._M_storage._M_storage.__align =
                 (anon_struct_8_0_00000001_for___align)&PTR___Deferred_state_00822810;
            local_108._M_ptr = p_Var6;
            p_Var7 = (_Result<void> *)operator_new(0x10);
            *(undefined8 *)p_Var7 = 0;
            *(undefined8 *)&p_Var7->field_0x8 = 0;
            std::__future_base::_Result<void>::_Result(p_Var7);
            *(_Result<void> **)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x20) = p_Var7;
            *(unsigned_long *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x28) =
                 puVar2[uVar10];
            *(BufferSTL **)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x30) = local_f8;
            *(Engine **)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x38) = engine;
            *(BP3Deserializer **)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x40) = local_f0;
            local_108._M_ptr = (pointer)0x0;
            std::
            __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/bp/bp3/BP3Deserializer.cpp:196:32),_std::reference_wrapper<adios2::core::Engine>,_std::reference_wrapper<const_std::vector<char,_std::allocator<char>_>_>,_unsigned_long>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/bp/bp3/BP3Deserializer.cpp:196:32),_std::reference_wrapper<adios2::core::Engine>,_std::reference_wrapper<const_std::vector<char,_std::allocator<char>_>_>,_unsigned_long>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
            ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_toolkit_format_bp_bp3_BP3Deserializer_cpp:196:32),_std::reference_wrapper<adios2::core::Engine>,_std::reference_wrapper<const_std::vector<char,_std::allocator<char>_>_>,_unsigned_long>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_toolkit_format_bp_bp3_BP3Deserializer_cpp:196:32),_std::reference_wrapper<adios2::core::Engine>,_std::reference_wrapper<const_std::vector<char,_std::allocator<char>_>_>,_unsigned_long>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                                *)&local_108);
            _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_108._M_alloc =
                 (allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_toolkit_format_bp_bp3_BP3Deserializer_cpp:196:32),_std::reference_wrapper<adios2::core::Engine>,_std::reference_wrapper<const_std::vector<char,_std::allocator<char>_>_>,_unsigned_long>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ornladios[P]ADIOS2_source_adios2_toolkit_format_bp_bp3_BP3Deserializer_cpp:196:32),_std::reference_wrapper<adios2::core::Engine>,_std::reference_wrapper<const_std::vector<char,_std::allocator<char>_>_>,_unsigned_long>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>
                  *)local_e8.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
            local_108._M_ptr =
                 (pointer)local_e8.
                          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi;
            local_e8.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 = (element_type *)&p_Var6->_M_impl;
            local_e8.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var6;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_108._M_ptr);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_70);
          }
          this_01 = &local_40;
          std::__basic_future<void>::__basic_future(this_01,&local_e8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_e8.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          std::future<void>::operator=
                    ((future<void> *)
                     ((long)&((asyncs.
                               super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super___basic_future<void>)._M_state.
                             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + lVar9),(future<void> *)this_01);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_40._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
        }
        lVar9 = lVar9 + 0x10;
      }
      bVar3 = true;
    }
    for (; this_00 !=
           &(asyncs.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->super___basic_future<void>;
        this_00 = this_00 + 1) {
      if ((this_00->_M_state).
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0) {
        std::__basic_future<void>::wait(this_00,this_01);
      }
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&asyncPositions.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::vector<std::future<void>,_std::allocator<std::future<void>_>_>::~vector(&asyncs);
  }
  return;
}

Assistant:

void BP3Deserializer::ParseVariablesIndex(const BufferSTL &bufferSTL, core::Engine &engine)
{
    auto lf_ReadElementIndex = [&](core::Engine &engine, const std::vector<char> &buffer,
                                   size_t position) {
        const ElementIndexHeader header =
            ReadElementIndexHeader(buffer, position, m_Minifooter.IsLittleEndian);

        switch (header.DataType)
        {

#define make_case(T)                                                                               \
    case (TypeTraits<T>::type_enum): {                                                             \
        DefineVariableInEngineIO<T>(header, engine, buffer, position);                             \
        break;                                                                                     \
    }
            ADIOS2_FOREACH_STDTYPE_1ARG(make_case)
#undef make_case

        } // end switch
    };

    const auto &buffer = bufferSTL.m_Buffer;
    size_t position =
        helper::GetDistance(m_Minifooter.VarsIndexStart, m_Minifooter.PGIndexStart,
                            " BP3 variable index start < pg index start, in call to Open");

    helper::ReadValue<uint32_t>(buffer, position, m_Minifooter.IsLittleEndian);
    helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);

    const size_t startPosition = position;
    size_t localPosition = 0;

    /* Note: In ADIOS 1.x BP3 files, length is unreliable and is
     * probably smaller than the actual length of the variable index. Let's use
     * here the more reliable limit: the start of attribute index - start of
     * variable index (- the already parsed 12 bytes)
     */
    const size_t varIndexLength =
        m_Minifooter.AttributesIndexStart - m_Minifooter.VarsIndexStart - 12;

    if (m_Parameters.Threads == 1)
    {
        while (localPosition < varIndexLength)
        {
            lf_ReadElementIndex(engine, buffer, position);

            const size_t elementIndexSize = static_cast<size_t>(
                helper::ReadValue<uint32_t>(buffer, position, m_Minifooter.IsLittleEndian));
            position += elementIndexSize;
            localPosition = position - startPosition;
        }
        return;
    }

    // threads for reading Variables
    std::vector<std::future<void>> asyncs(m_Parameters.Threads);
    std::vector<size_t> asyncPositions(m_Parameters.Threads);

    bool launched = false;

    while (localPosition < varIndexLength)
    {
        // extract async positions
        for (unsigned int t = 0; t < m_Parameters.Threads; ++t)
        {
            asyncPositions[t] = position;
            const size_t elementIndexSize = static_cast<size_t>(
                helper::ReadValue<uint32_t>(buffer, position, m_Minifooter.IsLittleEndian));
            position += elementIndexSize;
            localPosition = position - startPosition;

            if (launched)
            {
                asyncs[t].get();
            }

            if (localPosition <= varIndexLength)
            {
                asyncs[t] = std::async(std::launch::async, lf_ReadElementIndex, std::ref(engine),
                                       std::ref(buffer), asyncPositions[t]);
            }
        }
        launched = true;
    }

    for (auto &async : asyncs)
    {
        if (async.valid())
        {
            async.wait();
        }
    }
}